

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O2

void sx_dump_leaks(sx_dump_leak_cb dump_leak_fn)

{
  uint uVar1;
  stb__leakcheck_malloc_info *psVar2;
  size_t sVar3;
  stb__leakcheck_malloc_info **ppsVar4;
  char local_238 [520];
  
  ppsVar4 = &mi_head;
  while( true ) {
    psVar2 = *ppsVar4;
    if (psVar2 == (stb__leakcheck_malloc_info *)0x0) break;
    sVar3 = psVar2->size;
    if (-1 < (long)sVar3) {
      uVar1 = psVar2->line;
      sx_snprintf(local_238,0x200,"%-6s: %s@%d: %s: %$.2d at 0x%p","LEAKED",psVar2,(ulong)uVar1,
                  psVar2->func,sVar3,psVar2 + 1);
      if (dump_leak_fn == (sx_dump_leak_cb)0x0) {
        puts(local_238);
      }
      else {
        (*dump_leak_fn)(local_238,psVar2->file,psVar2->func,uVar1,sVar3,psVar2 + 1);
      }
    }
    ppsVar4 = &psVar2->next;
  }
  return;
}

Assistant:

void sx_dump_leaks(sx_dump_leak_cb dump_leak_fn)
{
    stb__leakcheck_malloc_info* mi = mi_head;
    while (mi) {
        if ((ptrdiff_t)mi->size >= 0) {
            stblkck_internal_print(dump_leak_fn, "LEAKED", mi->file, mi->func, mi->line, mi->size, mi + 1);
        }
        mi = mi->next;
    }
}